

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Vdbe * sqlite3VdbeCreate(Parse *pParse)

{
  sqlite3 *db_00;
  Vdbe *p;
  sqlite3 *db;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pParse_local = (Parse *)sqlite3DbMallocRawNN(db_00,0x130);
  if (pParse_local == (Parse *)0x0) {
    pParse_local = (Parse *)0x0;
  }
  else {
    memset(&pParse_local->nMaxArg,0,0xa8);
    pParse_local->db = db_00;
    if (db_00->pVdbe != (Vdbe *)0x0) {
      db_00->pVdbe->ppVPrev = &pParse_local->pVdbe;
    }
    pParse_local->pVdbe = db_00->pVdbe;
    pParse_local->zErrMsg = (char *)&db_00->pVdbe;
    db_00->pVdbe = (Vdbe *)pParse_local;
    *(Parse **)&pParse_local->rc = pParse;
    pParse->pVdbe = (Vdbe *)pParse_local;
    sqlite3VdbeAddOp2((Vdbe *)pParse_local,8,0,1);
  }
  return (Vdbe *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Vdbe *sqlite3VdbeCreate(Parse *pParse){
  sqlite3 *db = pParse->db;
  Vdbe *p;
  p = sqlite3DbMallocRawNN(db, sizeof(Vdbe) );
  if( p==0 ) return 0;
  memset(&p->aOp, 0, sizeof(Vdbe)-offsetof(Vdbe,aOp));
  p->db = db;
  if( db->pVdbe ){
    db->pVdbe->ppVPrev = &p->pVNext;
  }
  p->pVNext = db->pVdbe;
  p->ppVPrev = &db->pVdbe;
  db->pVdbe = p;
  assert( p->eVdbeState==VDBE_INIT_STATE );
  p->pParse = pParse;
  pParse->pVdbe = p;
  assert( pParse->aLabel==0 );
  assert( pParse->nLabel==0 );
  assert( p->nOpAlloc==0 );
  assert( pParse->szOpAlloc==0 );
  sqlite3VdbeAddOp2(p, OP_Init, 0, 1);
  return p;
}